

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O3

CURLcode ws_cw_write(Curl_easy *data,Curl_cwriter *writer,int type,char *buf,size_t nbytes)

{
  void *pvVar1;
  curl_trc_feat *pcVar2;
  _Bool _Var3;
  CURLcode CVar4;
  ssize_t sVar5;
  size_t sVar6;
  char *fmt;
  ws_decoder *dec;
  bufq *q;
  CURLcode result;
  ws_cw_dec_ctx pass_ctx;
  CURLcode local_5c;
  void *local_58;
  Curl_easy *local_50;
  void *local_48;
  Curl_cwriter *local_40;
  int local_38;
  
  if (((type & 1U) == 0) || (((data->set).field_0x8a2 & 0x80) != 0)) {
    CVar4 = Curl_cwriter_write(data,writer->next,type,buf,nbytes);
    return CVar4;
  }
  pvVar1 = writer->ctx;
  local_58 = Curl_conn_meta_get(data->conn,"meta:proto:ws:conn");
  if (local_58 == (void *)0x0) {
    Curl_failf(data,"WS: not a websocket transfer");
    CVar4 = CURLE_FAILED_INIT;
  }
  else if ((nbytes == 0) ||
          (sVar5 = Curl_bufq_write((bufq *)((long)pvVar1 + 0x20),(uchar *)buf,nbytes,&local_5c),
          -1 < sVar5)) {
    q = (bufq *)((long)pvVar1 + 0x20);
    _Var3 = Curl_bufq_is_empty(q);
    if (!_Var3) {
      dec = (ws_decoder *)((long)local_58 + 8);
      do {
        local_48 = local_58;
        local_40 = writer->next;
        local_50 = data;
        local_38 = type;
        local_5c = ws_dec_pass(dec,data,q,ws_cw_dec_next,&local_50);
        if (local_5c != CURLE_OK) {
          if (local_5c == CURLE_AGAIN) {
            if (data == (Curl_easy *)0x0) {
              return CURLE_OK;
            }
            if (((data->set).field_0x89f & 0x40) == 0) {
              return CURLE_OK;
            }
            pcVar2 = (data->state).feat;
            if ((pcVar2 != (curl_trc_feat *)0x0) && (pcVar2->log_level < 1)) {
              return CURLE_OK;
            }
            if (Curl_trc_feat_write.log_level < 1) {
              return CURLE_OK;
            }
            Curl_trc_write(data,"websocket, buffered incomplete frame head");
            return CURLE_OK;
          }
          if (data == (Curl_easy *)0x0) {
            return local_5c;
          }
          if (((data->set).field_0x89f & 0x40) == 0) {
            return local_5c;
          }
          pcVar2 = (data->state).feat;
          if ((pcVar2 != (curl_trc_feat *)0x0) && (pcVar2->log_level < 1)) {
            return local_5c;
          }
          fmt = "WS: decode error %d";
          goto LAB_00168a01;
        }
        _Var3 = Curl_bufq_is_empty(q);
      } while (!_Var3);
    }
    CVar4 = CURLE_OK;
    if ((((((char)type < '\0') && (_Var3 = Curl_bufq_is_empty(q), CVar4 = CURLE_OK, !_Var3)) &&
         (CVar4 = CURLE_RECV_ERROR, data != (Curl_easy *)0x0)) &&
        (((data->set).field_0x89f & 0x40) != 0)) &&
       ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
      sVar6 = Curl_bufq_len(q);
      Curl_infof(data,"WS: decode ending with %zd frame bytes remaining",sVar6);
    }
  }
  else {
    CVar4 = local_5c;
    if ((((data->set).field_0x89f & 0x40) != 0) &&
       ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
      fmt = "WS: error adding data to buffer %d";
LAB_00168a01:
      Curl_infof(data,fmt,(ulong)local_5c);
      CVar4 = local_5c;
    }
  }
  return CVar4;
}

Assistant:

static CURLcode ws_cw_write(struct Curl_easy *data,
                            struct Curl_cwriter *writer, int type,
                            const char *buf, size_t nbytes)
{
  struct ws_cw_ctx *ctx = writer->ctx;
  struct websocket *ws;
  CURLcode result;

  if(!(type & CLIENTWRITE_BODY) || data->set.ws_raw_mode)
    return Curl_cwriter_write(data, writer->next, type, buf, nbytes);

  ws = Curl_conn_meta_get(data->conn, CURL_META_PROTO_WS_CONN);
  if(!ws) {
    failf(data, "WS: not a websocket transfer");
    return CURLE_FAILED_INIT;
  }

  if(nbytes) {
    ssize_t nwritten;
    nwritten = Curl_bufq_write(&ctx->buf, (const unsigned char *)buf,
                               nbytes, &result);
    if(nwritten < 0) {
      infof(data, "WS: error adding data to buffer %d", result);
      return result;
    }
  }

  while(!Curl_bufq_is_empty(&ctx->buf)) {
    struct ws_cw_dec_ctx pass_ctx;
    pass_ctx.data = data;
    pass_ctx.ws = ws;
    pass_ctx.next_writer = writer->next;
    pass_ctx.cw_type = type;
    result = ws_dec_pass(&ws->dec, data, &ctx->buf,
                         ws_cw_dec_next, &pass_ctx);
    if(result == CURLE_AGAIN) {
      /* insufficient amount of data, keep it for later.
       * we pretend to have written all since we have a copy */
      CURL_TRC_WRITE(data, "websocket, buffered incomplete frame head");
      return CURLE_OK;
    }
    else if(result) {
      infof(data, "WS: decode error %d", (int)result);
      return result;
    }
  }

  if((type & CLIENTWRITE_EOS) && !Curl_bufq_is_empty(&ctx->buf)) {
    infof(data, "WS: decode ending with %zd frame bytes remaining",
          Curl_bufq_len(&ctx->buf));
    return CURLE_RECV_ERROR;
  }

  return CURLE_OK;
}